

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O1

void __thiscall
diy::detail::ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners>::operator()
          (ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners> *this,PointBlock<3U> *b,
          ProxyWithLink *cp)

{
  RegularMergePartners *this_00;
  uint uVar1;
  pointer pDVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  const_iterator __begin4;
  pointer pBVar7;
  bool bVar8;
  BlockID target;
  vector<int,_std::allocator<int>_> outgoing_gids;
  vector<int,_std::allocator<int>_> incoming_gids;
  ReduceProxy rp;
  BlockID local_160;
  GIDVector local_158;
  vector<int,_std::allocator<int>_> local_138;
  ReduceProxy local_118;
  
  this_00 = &this->partners;
  uVar1 = this->round;
  local_118.super_Proxy._0_8_ = (int *)0x0;
  local_118.super_Proxy.master_ = (Master *)0x0;
  local_118.super_Proxy.iexchange_ = (IExchangeInfo *)0x0;
  RegularDecomposer<diy::Bounds<int>_>::gid_to_coords
            ((cp->super_Proxy).gid_,(DivisionsVector *)&local_118,(DivisionsVector *)this_00);
  bVar8 = (int)uVar1 < 1;
  if (0 < (int)uVar1) {
    pDVar2 = (this->partners).super_RegularPartners.kvs_.
             super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar3 = (this->partners).super_RegularPartners.steps_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)*(int *)(local_118.super_Proxy._0_8_ + (long)pDVar2->dim * 4) / (long)*piVar3;
    if ((int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) %
             (long)pDVar2->size) == 0) {
      uVar4 = 1;
      do {
        uVar6 = uVar4;
        if (uVar1 == uVar6) break;
        uVar5 = (long)*(int *)(local_118.super_Proxy._0_8_ + (long)pDVar2[uVar6].dim * 4) /
                (long)piVar3[uVar6];
        uVar4 = uVar6 + 1;
      } while ((int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) %
                    (long)pDVar2[uVar6].size) == 0);
      bVar8 = uVar1 <= uVar6;
    }
    else {
      bVar8 = false;
    }
  }
  if ((int *)local_118.super_Proxy._0_8_ != (int *)0x0) {
    operator_delete((void *)local_118.super_Proxy._0_8_,
                    (long)local_118.super_Proxy.iexchange_ - local_118.super_Proxy._0_8_);
  }
  if (bVar8) {
    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    if (0 < this->round) {
      RegularPartners::fill
                (&this_00->super_RegularPartners,this->round + -1,(cp->super_Proxy).gid_,&local_138)
      ;
    }
    if (this->round <
        (int)((ulong)((long)(this->partners).super_RegularPartners.kvs_.
                            super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->partners).super_RegularPartners.kvs_.
                           super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      local_118.super_Proxy._0_8_ = (int *)0x0;
      local_118.super_Proxy.master_ = (Master *)0x0;
      local_118.super_Proxy.iexchange_ = (IExchangeInfo *)0x0;
      RegularPartners::fill
                (&this_00->super_RegularPartners,this->round,(cp->super_Proxy).gid_,
                 (vector<int,_std::allocator<int>_> *)&local_118);
      if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_158,
                   (iterator)
                   local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_118.super_Proxy._0_8_);
      }
      else {
        *local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = *(int *)local_118.super_Proxy._0_8_;
        local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if ((int *)local_118.super_Proxy._0_8_ != (int *)0x0) {
        operator_delete((void *)local_118.super_Proxy._0_8_,
                        (long)local_118.super_Proxy.iexchange_ - local_118.super_Proxy._0_8_);
      }
    }
    ReduceProxy::ReduceProxy
              (&local_118,&cp->super_Proxy,b,this->round,this->assigner,&local_138,&local_158);
    local_160 = (BlockID)b;
    if ((this->reduce).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->reduce)._M_invoker)
              ((_Any_data *)&this->reduce,(PointBlock<3U> **)&local_160,&local_118,this_00);
    if ((local_118.super_Proxy.outgoing_._M_t._M_impl.super__Rb_tree_header._M_node_count <
         (ulong)(long)(int)((ulong)((long)local_118.out_link_.neighbors_.
                                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_118.out_link_.neighbors_.
                                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
       (local_118.out_link_.neighbors_.
        super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_118.out_link_.neighbors_.
        super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      pBVar7 = local_118.out_link_.neighbors_.
               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_160 = *pBVar7;
        Catch::clara::std::
        map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
        ::operator[]((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                      *)((long)&local_118 + 0x48),&local_160);
        pBVar7 = pBVar7 + 1;
      } while (pBVar7 != local_118.out_link_.neighbors_.
                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    local_118.out_link_.super_Factory<diy::Link>._vptr_Factory =
         (_func_int **)&PTR_id_abi_cxx11__001d06e0;
    if (local_118.out_link_.neighbors_.
        super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.out_link_.neighbors_.
                      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_118.out_link_.neighbors_.
                            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.out_link_.neighbors_.
                            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_118.in_link_.super_Factory<diy::Link>._vptr_Factory =
         (_func_int **)&PTR_id_abi_cxx11__001d06e0;
    if (local_118.in_link_.neighbors_.
        super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.in_link_.neighbors_.
                      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_118.in_link_.neighbors_.
                            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.in_link_.neighbors_.
                            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    Master::Proxy::~Proxy(&local_118.super_Proxy);
    if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void        operator()(Block* b, const Master::ProxyWithLink& cp) const
    {
      if (!partners.active(round, cp.gid(), *cp.master())) return;

      std::vector<int> incoming_gids, outgoing_gids;
      if (round > 0)
          partners.incoming(round, cp.gid(), incoming_gids, *cp.master());        // receive from the previous round
      if (round < static_cast<int>(partners.rounds()))
          partners.outgoing(round, cp.gid(), outgoing_gids, *cp.master());        // send to the next round

      ReduceProxy   rp(std::move(const_cast<Master::ProxyWithLink&>(cp)), b, round, assigner, incoming_gids, outgoing_gids);
      reduce(b, rp, partners);

      // touch the outgoing queues to make sure they exist
      Master::Proxy::OutgoingQueues& outgoing = *rp.outgoing();
      if (outgoing.size() < static_cast<size_t>(rp.out_link().size()))
        for (BlockID target : rp.out_link().neighbors())
          outgoing[target];       // touch the outgoing queue, creating it if necessary
    }